

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O2

rb_tree_node_base *
nestl::impl::detail::rb_tree_rebalance_for_erase(rb_tree_node_base *z,rb_tree_node_base *header)

{
  base_ptr *root;
  rb_tree_color rVar1;
  base_ptr prVar2;
  base_ptr *pprVar3;
  base_ptr prVar4;
  base_ptr prVar5;
  rb_tree_node_base *prVar6;
  rb_tree_node_base *x;
  base_ptr x_00;
  
  root = &header->m_parent;
  prVar4 = z->m_left;
  prVar5 = z->m_right;
  prVar2 = prVar5;
  prVar6 = z;
  if (prVar4 == (base_ptr)0x0) {
LAB_0010bf6b:
    x_00 = prVar6->m_parent;
    if (prVar2 != (base_ptr)0x0) goto LAB_0010bf77;
    prVar2 = (base_ptr)0x0;
  }
  else {
    if (prVar5 != (base_ptr)0x0) {
      do {
        prVar6 = prVar2;
        prVar2 = prVar6->m_left;
      } while (prVar6->m_left != (base_ptr)0x0);
      prVar2 = prVar6->m_right;
      if (prVar6 != z) {
        prVar4->m_parent = prVar6;
        prVar6->m_left = prVar4;
        x_00 = prVar6;
        if (prVar6 != prVar5) {
          x_00 = prVar6->m_parent;
          prVar4 = x_00;
          if (prVar2 != (base_ptr)0x0) {
            prVar2->m_parent = x_00;
            prVar4 = prVar6->m_parent;
          }
          prVar4->m_left = prVar2;
          prVar6->m_right = prVar5;
          z->m_right->m_parent = prVar6;
        }
        if (*root == z) {
          *root = prVar6;
          prVar4 = z->m_parent;
        }
        else {
          prVar4 = z->m_parent;
          if (prVar4->m_left == z) {
            prVar4->m_left = prVar6;
          }
          else {
            prVar4->m_right = prVar6;
          }
        }
        prVar6->m_parent = prVar4;
        rVar1 = prVar6->m_color;
        prVar6->m_color = z->m_color;
        z->m_color = rVar1;
        prVar6 = z;
        goto LAB_0010c005;
      }
      goto LAB_0010bf6b;
    }
    x_00 = z->m_parent;
    prVar2 = prVar4;
LAB_0010bf77:
    prVar2->m_parent = x_00;
  }
  pprVar3 = root;
  if (*root != z) {
    prVar4 = z->m_parent;
    pprVar3 = &prVar4->m_right;
    if (prVar4->m_left == z) {
      pprVar3 = &prVar4->m_left;
    }
  }
  *pprVar3 = prVar2;
  if (header->m_left == z) {
    if (z->m_right == (base_ptr)0x0) {
      prVar4 = z->m_parent;
    }
    else {
      prVar4 = rb_tree_node_base::s_minimum(prVar2);
    }
    header->m_left = prVar4;
  }
  if (header->m_right == z) {
    if (z->m_left == (base_ptr)0x0) {
      prVar4 = z->m_parent;
    }
    else {
      prVar4 = rb_tree_node_base::s_maximum(prVar2);
    }
    header->m_right = prVar4;
  }
  rVar1 = prVar6->m_color;
LAB_0010c005:
  if (rVar1 != rb_red) {
    while (prVar2 != *root) {
      if ((prVar2 != (base_ptr)0x0) && (prVar2->m_color != rb_black)) goto LAB_0010c155;
      x = x_00->m_left;
      if (prVar2 == x) {
        x = x_00->m_right;
        if (x->m_color == rb_red) {
          x->m_color = rb_black;
          x_00->m_color = rb_red;
          local_rb_tree_rotate_left(x_00,root);
          x = x_00->m_right;
        }
        prVar4 = x->m_left;
        if ((prVar4 == (base_ptr)0x0) || (prVar4->m_color == rb_black)) {
          prVar5 = x->m_right;
          if ((prVar5 == (base_ptr)0x0) || (prVar5->m_color == rb_black)) goto LAB_0010c0ad;
        }
        else {
          prVar5 = x->m_right;
          if ((prVar5 == (base_ptr)0x0) || (prVar5->m_color == rb_black)) {
            prVar4->m_color = rb_black;
            x->m_color = rb_red;
            local_rb_tree_rotate_right(x,root);
            x = x_00->m_right;
            prVar5 = x->m_right;
          }
        }
        x->m_color = x_00->m_color;
        x_00->m_color = rb_black;
        if (prVar5 != (base_ptr)0x0) {
          prVar5->m_color = rb_black;
        }
        local_rb_tree_rotate_left(x_00,root);
        break;
      }
      if (x->m_color == rb_red) {
        x->m_color = rb_black;
        x_00->m_color = rb_red;
        local_rb_tree_rotate_right(x_00,root);
        x = x_00->m_left;
      }
      prVar4 = x->m_right;
      if ((prVar4 != (base_ptr)0x0) && (prVar4->m_color != rb_black)) {
        prVar5 = x->m_left;
        if ((prVar5 == (base_ptr)0x0) || (prVar5->m_color == rb_black)) {
          prVar4->m_color = rb_black;
          x->m_color = rb_red;
          local_rb_tree_rotate_left(x,root);
          x = x_00->m_left;
          prVar5 = x->m_left;
        }
LAB_0010c0e3:
        x->m_color = x_00->m_color;
        x_00->m_color = rb_black;
        if (prVar5 != (base_ptr)0x0) {
          prVar5->m_color = rb_black;
        }
        local_rb_tree_rotate_right(x_00,root);
        break;
      }
      prVar5 = x->m_left;
      if ((prVar5 != (base_ptr)0x0) && (prVar5->m_color != rb_black)) goto LAB_0010c0e3;
LAB_0010c0ad:
      x->m_color = rb_red;
      prVar2 = x_00;
      x_00 = x_00->m_parent;
    }
    if (prVar2 != (base_ptr)0x0) {
LAB_0010c155:
      prVar2->m_color = rb_black;
    }
  }
  return prVar6;
}

Assistant:

inline rb_tree_node_base*
rb_tree_rebalance_for_erase(rb_tree_node_base* const z,
                            rb_tree_node_base& header) NESTL_NOEXCEPT_SPEC
{
    rb_tree_node_base *& root = header.m_parent;
    rb_tree_node_base *& leftmost = header.m_left;
    rb_tree_node_base *& rightmost = header.m_right;
    rb_tree_node_base* y = z;
    rb_tree_node_base* x = 0;
    rb_tree_node_base* x_parent = 0;

    if (y->m_left == 0)     // z has at most one non-null child. y == z.
        x = y->m_right;     // x might be null.
    else
        if (y->m_right == 0)  // z has exactly one non-null child. y == z.
            x = y->m_left;    // x is not null.
        else
        {
            // z has two non-null children.  Set y to
            y = y->m_right;   //   z's successor.  x might be null.
            while (y->m_left != 0)
                y = y->m_left;
            x = y->m_right;
        }
    if (y != z)
    {
        // relink y in place of z.  y is z's successor
        z->m_left->m_parent = y;
        y->m_left = z->m_left;
        if (y != z->m_right)
        {
            x_parent = y->m_parent;
            if (x) x->m_parent = y->m_parent;
            y->m_parent->m_left = x;   // y must be a child of m_left
            y->m_right = z->m_right;
            z->m_right->m_parent = y;
        }
        else
            x_parent = y;
        if (root == z)
            root = y;
        else if (z->m_parent->m_left == z)
            z->m_parent->m_left = y;
        else
            z->m_parent->m_right = y;
        y->m_parent = z->m_parent;
        std::swap(y->m_color, z->m_color);
        y = z;
        // y now points to node to be actually deleted
    }
    else
    {                        // y == z
        x_parent = y->m_parent;
        if (x)
            x->m_parent = y->m_parent;
        if (root == z)
            root = x;
        else
            if (z->m_parent->m_left == z)
                z->m_parent->m_left = x;
            else
                z->m_parent->m_right = x;
        if (leftmost == z)
        {
            if (z->m_right == 0)        // z->m_left must be null also
                leftmost = z->m_parent;
            // makes leftmost == _M_header if z == root
            else
                leftmost = rb_tree_node_base::s_minimum(x);
        }
        if (rightmost == z)
        {
            if (z->m_left == 0)         // z->m_right must be null also
                rightmost = z->m_parent;
            // makes rightmost == _M_header if z == root
            else                      // x == z->m_left
                rightmost = rb_tree_node_base::s_maximum(x);
        }
    }
    if (y->m_color != rb_red)
      {
    while (x != root && (x == 0 || x->m_color == rb_black))
      if (x == x_parent->m_left)
        {
          rb_tree_node_base* w = x_parent->m_right;
          if (w->m_color == rb_red)
        {
          w->m_color = rb_black;
          x_parent->m_color = rb_red;
          local_rb_tree_rotate_left(x_parent, root);
          w = x_parent->m_right;
        }
          if ((w->m_left == 0 ||
           w->m_left->m_color == rb_black) &&
          (w->m_right == 0 ||
           w->m_right->m_color == rb_black))
        {
          w->m_color = rb_red;
          x = x_parent;
          x_parent = x_parent->m_parent;
        }
          else
        {
          if (w->m_right == 0
              || w->m_right->m_color == rb_black)
            {
              w->m_left->m_color = rb_black;
              w->m_color = rb_red;
              local_rb_tree_rotate_right(w, root);
              w = x_parent->m_right;
            }
          w->m_color = x_parent->m_color;
          x_parent->m_color = rb_black;
          if (w->m_right)
            w->m_right->m_color = rb_black;
          local_rb_tree_rotate_left(x_parent, root);
          break;
        }
        }
      else
        {
          // same as above, with m_right <-> m_left.
          rb_tree_node_base* w = x_parent->m_left;
          if (w->m_color == rb_red)
        {
          w->m_color = rb_black;
          x_parent->m_color = rb_red;
          local_rb_tree_rotate_right(x_parent, root);
          w = x_parent->m_left;
        }
          if ((w->m_right == 0 ||
           w->m_right->m_color == rb_black) &&
          (w->m_left == 0 ||
           w->m_left->m_color == rb_black))
        {
          w->m_color = rb_red;
          x = x_parent;
          x_parent = x_parent->m_parent;
        }
          else
        {
          if (w->m_left == 0 || w->m_left->m_color == rb_black)
            {
              w->m_right->m_color = rb_black;
              w->m_color = rb_red;
              local_rb_tree_rotate_left(w, root);
              w = x_parent->m_left;
            }
          w->m_color = x_parent->m_color;
          x_parent->m_color = rb_black;
          if (w->m_left)
            w->m_left->m_color = rb_black;
          local_rb_tree_rotate_right(x_parent, root);
          break;
        }
        }
    if (x) x->m_color = rb_black;
      }
    return y;
  }